

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
create_pattern_tree(pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                    *__return_storage_ptr__,string *doc)

{
  undefined8 uVar1;
  pointer pOVar2;
  size_type sVar3;
  DocoptLanguageError *this;
  Option *opt;
  pointer pOVar4;
  __node_base *p_Var5;
  PatternList children;
  undefined1 local_198 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  string *local_170;
  undefined1 local_168 [16];
  vector<docopt::Option,_std::allocator<docopt::Option>_> doc_options;
  undefined1 local_140 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usage_sections;
  UniqueOptions uniq_pattern_options;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> pattern_options;
  UniqueOptions uniq_doc_options;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  Required pattern;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_48;
  
  std::__cxx11::string::string
            ((string *)&uniq_pattern_options,"usage:",(allocator *)&uniq_doc_options);
  parse_section(&usage_sections,(string *)&uniq_pattern_options,doc);
  std::__cxx11::string::~string((string *)&uniq_pattern_options);
  if (usage_sections.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      usage_sections.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
    docopt::DocoptLanguageError::runtime_error(this,"\'usage:\' (case-insensitive) not found.");
  }
  else {
    if ((ulong)((long)usage_sections.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)usage_sections.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      parse_defaults(&options,doc);
      formal_usage((string *)&uniq_pattern_options,
                   usage_sections.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      parse_pattern(&pattern,(string *)&uniq_pattern_options,&options);
      std::__cxx11::string::~string((string *)&uniq_pattern_options);
      flat_filter<docopt::Option_const>(&pattern_options,(Pattern *)&pattern);
      std::
      _Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
                ((_Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&uniq_pattern_options,
                 pattern_options.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 pattern_options.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,&uniq_doc_options,local_140,
                 &doc_options);
      aStack_180._8_8_ = __return_storage_ptr__;
      flat_filter<docopt::OptionsShortcut>
                ((vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *)
                 local_140,(Pattern *)&pattern);
      local_168._0_8_ = local_140._8_8_;
      local_170 = doc;
      while (local_140._0_8_ != local_168._0_8_) {
        local_168._8_8_ = local_140._0_8_;
        parse_defaults(&doc_options,local_170);
        pOVar2 = doc_options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uniq_doc_options._M_h._M_buckets = &uniq_doc_options._M_h._M_single_bucket;
        uniq_doc_options._M_h._M_bucket_count = 1;
        uniq_doc_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        uniq_doc_options._M_h._M_element_count = 0;
        uniq_doc_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        uniq_doc_options._M_h._M_rehash_policy._M_next_resize = 0;
        uniq_doc_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
        for (pOVar4 = doc_options.
                      super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar4 != pOVar2; pOVar4 = pOVar4 + 1) {
          children.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar4;
          sVar3 = std::
                  _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&uniq_pattern_options._M_h,(key_type *)&children);
          if (sVar3 == 0) {
            children.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar4;
            std::__detail::
            _Insert<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::insert((_Insert<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                      *)&uniq_doc_options,(value_type *)&children);
          }
        }
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var5 = &uniq_doc_options._M_h._M_before_begin;
        while (uVar1 = local_168._8_8_, p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
          std::make_shared<docopt::Option,docopt::Option_const&>((Option *)local_198);
          local_198._16_8_ = local_198._0_8_;
          aStack_180._M_allocated_capacity = local_198._8_8_;
          local_198._0_8_ = (_func_int **)0x0;
          local_198._8_8_ = (pointer)0x0;
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Pattern>>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)&children,(shared_ptr<docopt::Pattern> *)(local_198 + 0x10));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_180._M_allocated_capacity
                    );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
        }
        local_48.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             children.
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             children.
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             children.
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::_M_move_assign(&(((OptionsShortcut *)((_Alloc_hider *)local_168._8_8_)->_M_p)->
                          super_Optional).super_BranchPattern.fChildren,&local_48);
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector(&local_48);
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)&children);
        std::
        _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&uniq_doc_options._M_h);
        std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&doc_options);
        local_140._0_8_ = uVar1 + 8;
      }
      std::_Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>::
      ~_Vector_base((_Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                     *)local_140);
      uVar1 = aStack_180._8_8_;
      (((PatternList *)(aStack_180._8_8_ + 8))->
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           pattern.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(aStack_180._8_8_ + 0x10) =
           pattern.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(aStack_180._8_8_ + 0x18) =
           pattern.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pattern.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pattern.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pattern.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined ***)aStack_180._8_8_ = &PTR_flat_001d7490;
      (((vector<docopt::Option,_std::allocator<docopt::Option>_> *)(aStack_180._8_8_ + 0x20))->
      super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>)._M_impl.
      super__Vector_impl_data._M_start =
           options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)(aStack_180._8_8_ + 0x28) =
           options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)(aStack_180._8_8_ + 0x30) =
           options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      options.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniq_pattern_options._M_h);
      std::_Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::
      ~_Vector_base(&pattern_options.
                     super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                   );
      docopt::BranchPattern::~BranchPattern(&pattern.super_BranchPattern);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&options);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&usage_sections);
      return (pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
              *)uVar1;
    }
    this = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
    docopt::DocoptLanguageError::runtime_error(this,"More than one \'usage:\' (case-insensitive).");
  }
  __cxa_throw(this,&docopt::DocoptLanguageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<Required, std::vector<Option>> create_pattern_tree(std::string const& doc)
{
	auto usage_sections = parse_section("usage:", doc);
	if (usage_sections.empty()) {
		throw DocoptLanguageError("'usage:' (case-insensitive) not found.");
	}
	if (usage_sections.size() > 1) {
		throw DocoptLanguageError("More than one 'usage:' (case-insensitive).");
	}
	
	std::vector<Option> options = parse_defaults(doc);
	Required pattern = parse_pattern(formal_usage(usage_sections[0]), options);
	
	std::vector<Option const*> pattern_options = flat_filter<Option const>(pattern);
	
	using UniqueOptions = std::unordered_set<Option const*, PatternHasher, PatternPointerEquality>;
	UniqueOptions const uniq_pattern_options { pattern_options.begin(), pattern_options.end() };
	
	// Fix up any "[options]" shortcuts with the actual option tree
	for(auto& options_shortcut : flat_filter<OptionsShortcut>(pattern)) {
		std::vector<Option> doc_options = parse_defaults(doc);
		
		// set(doc_options) - set(pattern_options)
		UniqueOptions uniq_doc_options;
		for(auto const& opt : doc_options) {
			if (uniq_pattern_options.count(&opt))
				continue;
			uniq_doc_options.insert(&opt);
		}
		
		// turn into shared_ptr's and set as children
		PatternList children;
		std::transform(uniq_doc_options.begin(), uniq_doc_options.end(),
			       std::back_inserter(children), [](Option const* opt) {
				       return std::make_shared<Option>(*opt);
			       });
		options_shortcut->setChildren(std::move(children));
	}
	
	return { std::move(pattern), std::move(options) };
}